

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoCore.c
# Opt level: O0

void reoReorderArray(reo_man *p,DdManager *dd,DdNode **Funcs,DdNode **FuncsRes,int nFuncs,
                    int *pOrder)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  reo_unit *prVar4;
  DdNode *pDVar5;
  int local_64;
  int *local_58;
  int *pOrder_1;
  DdNode *FuncRemapped;
  int local_40;
  int fVerification;
  int i;
  int Counter;
  int *pOrder_local;
  int nFuncs_local;
  DdNode **FuncsRes_local;
  DdNode **Funcs_local;
  DdManager *dd_local;
  reo_man *p_local;
  
  p->dd = dd;
  p->pOrder = pOrder;
  p->nTops = nFuncs;
  iVar2 = Cudd_SharingSize(Funcs,nFuncs);
  p->nNodesBeg = iVar2;
  if (dd->size < dd->sizeZ) {
    local_64 = dd->sizeZ;
  }
  else {
    local_64 = dd->size;
  }
  reoResizeStructures(p,local_64,p->nNodesBeg,nFuncs);
  piVar3 = Extra_VectorSupportArray(dd,Funcs,nFuncs,p->pSupp);
  p->pSupp = piVar3;
  p->nSupp = 0;
  for (local_40 = 0; local_40 < dd->size; local_40 = local_40 + 1) {
    p->nSupp = p->pSupp[local_40] + p->nSupp;
  }
  if (p->nSupp == 0) {
    for (local_40 = 0; local_40 < nFuncs; local_40 = local_40 + 1) {
      FuncsRes[local_40] = Funcs[local_40];
      Cudd_Ref(FuncsRes[local_40]);
    }
  }
  else {
    fVerification = 0;
    for (local_40 = 0; local_40 < dd->size; local_40 = local_40 + 1) {
      if (p->pSupp[dd->invperm[local_40]] != 0) {
        p->pMapToPlanes[dd->invperm[local_40]] = fVerification;
        p->pMapToDdVarsOrig[fVerification] = dd->invperm[local_40];
        if (p->fRemapUp == 0) {
          p->pMapToDdVarsFinal[fVerification] = dd->invperm[local_40];
        }
        else {
          p->pMapToDdVarsFinal[fVerification] = dd->invperm[fVerification];
        }
        p->pOrderInt[fVerification] = fVerification;
        fVerification = fVerification + 1;
      }
    }
    p->nUnitsUsed = 0;
    p->nNodesCur = 0;
    p->fThisIsAdd = 0;
    p->Signature = p->Signature + 1;
    for (local_40 = 0; local_40 < nFuncs; local_40 = local_40 + 1) {
      prVar4 = reoTransferNodesToUnits_rec(p,Funcs[local_40]);
      p->pTops[local_40] = prVar4;
    }
    if (p->nNodesBeg != p->nNodesCur) {
      __assert_fail("p->nNodesBeg == p->nNodesCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                    ,0x67,
                    "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                   );
    }
    if ((p->fThisIsAdd == 0) && (p->fMinWidth != 0)) {
      printf("An important message from the REO reordering engine:\n");
      printf("The BDD given to the engine for reordering contains complemented edges.\n");
      printf("Currently, such BDDs cannot be reordered for the minimum width.\n");
      printf("Therefore, minimization for the number of BDD nodes is performed.\n");
      fflush(_stdout);
      p->fMinApl = 0;
      p->fMinWidth = 0;
    }
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        reoProfileNodesStart(p);
      }
      else {
        reoProfileAplStart(p);
      }
    }
    else {
      reoProfileWidthStart(p);
    }
    if (p->fVerbose != 0) {
      printf("INITIAL:\n");
      if (p->fMinWidth == 0) {
        if (p->fMinApl == 0) {
          reoProfileNodesPrint(p);
        }
        else {
          reoProfileAplPrint(p);
        }
      }
      else {
        reoProfileWidthPrint(p);
      }
    }
    p->nSwaps = 0;
    p->nNISwaps = 0;
    for (local_40 = 0; local_40 < p->nIters; local_40 = local_40 + 1) {
      reoReorderSift(p);
      if (p->fVerbose != 0) {
        printf("ITER #%d:\n",(ulong)(local_40 + 1));
        if (p->fMinWidth == 0) {
          if (p->fMinApl == 0) {
            reoProfileNodesPrint(p);
          }
          else {
            reoProfileAplPrint(p);
          }
        }
        else {
          reoProfileWidthPrint(p);
        }
      }
      if (p->fMinWidth == 0) {
        if (p->fMinApl == 0) {
          p->nNodesEnd = p->nNodesCur;
          if (p->nNodesBeg < p->nNodesEnd) {
            __assert_fail("p->nNodesEnd <= p->nNodesBeg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                          ,0xaa,
                          "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                         );
          }
          if (p->nNodesEnd == p->nNodesBeg) break;
        }
        else {
          p->nAplEnd = p->nAplCur;
          if (p->nAplBeg < p->nAplEnd) {
            __assert_fail("p->nAplEnd <= p->nAplBeg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                          ,0xa3,
                          "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                         );
          }
          if ((p->nAplEnd == p->nAplBeg) && (!NAN(p->nAplEnd) && !NAN(p->nAplBeg))) break;
        }
      }
      else {
        p->nWidthEnd = p->nWidthCur;
        if (p->nWidthBeg < p->nWidthEnd) {
          __assert_fail("p->nWidthEnd <= p->nWidthBeg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0x9c,
                        "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                       );
        }
        if (p->nWidthEnd == p->nWidthBeg) break;
      }
    }
    iVar2 = reoCheckLevels(p);
    if (iVar2 == 0) {
      __assert_fail("reoCheckLevels( p )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                    ,0xaf,
                    "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                   );
    }
    s_AplBefore = p->nAplBeg;
    s_AplAfter = p->nAplEnd;
    p->nRefNodes = 0;
    p->nNodesCur = 0;
    p->Signature = p->Signature + 1;
    for (local_40 = 0; local_40 < nFuncs; local_40 = local_40 + 1) {
      pDVar5 = reoTransferUnitsToNodes_rec(p,p->pTops[local_40]);
      FuncsRes[local_40] = pDVar5;
      Cudd_Ref(FuncsRes[local_40]);
    }
    for (local_40 = 0; local_40 < p->nRefNodes; local_40 = local_40 + 1) {
      Cudd_RecursiveDeref(dd,p->pRefNodes[local_40]);
    }
    for (local_40 = 0; local_40 < nFuncs; local_40 = local_40 + 1) {
      iVar2 = reoRecursiveDeref(p->pTops[local_40]);
      if (iVar2 == 0) {
        __assert_fail("reoRecursiveDeref( p->pTops[i] )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                      ,0xc4,
                      "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                     );
      }
    }
    iVar2 = reoCheckZeroRefs(p->pPlanes + p->nSupp);
    if (iVar2 == 0) {
      __assert_fail("reoCheckZeroRefs( &(p->pPlanes[p->nSupp]) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                    ,0xc6,
                    "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                   );
    }
    if (p->pOrder != (int *)0x0) {
      for (local_40 = 0; local_40 < p->nSupp; local_40 = local_40 + 1) {
        p->pOrder[p->pMapToDdVarsFinal[local_40]] = p->pMapToDdVarsOrig[p->pOrderInt[local_40]];
      }
    }
    if (p->fVerify != 0) {
      if (p->pOrder == (int *)0x0) {
        local_58 = (int *)malloc((long)p->nSupp << 2);
        for (local_40 = 0; local_40 < p->nSupp; local_40 = local_40 + 1) {
          local_58[p->pMapToDdVarsFinal[local_40]] = p->pMapToDdVarsOrig[p->pOrderInt[local_40]];
        }
      }
      else {
        local_58 = p->pOrder;
      }
      bVar1 = true;
      for (local_40 = 0; local_40 < nFuncs; local_40 = local_40 + 1) {
        if (p->fThisIsAdd == 0) {
          pOrder_1 = (int *)Cudd_bddPermute(dd,FuncsRes[local_40],local_58);
        }
        else {
          pOrder_1 = (int *)Cudd_addPermute(dd,FuncsRes[local_40],local_58);
        }
        Cudd_Ref((DdNode *)pOrder_1);
        if ((DdNode *)pOrder_1 != Funcs[local_40]) {
          bVar1 = false;
          printf("REO: Internal verification has failed!\n");
          fflush(_stdout);
        }
        Cudd_RecursiveDeref(dd,(DdNode *)pOrder_1);
      }
      if (bVar1) {
        printf("REO: Internal verification is okay!\n");
      }
      if ((p->pOrder == (int *)0x0) && (local_58 != (int *)0x0)) {
        free(local_58);
      }
    }
    for (local_40 = 0; local_40 <= p->nSupp; local_40 = local_40 + 1) {
      reoUnitsRecycleUnitList(p,p->pPlanes + local_40);
    }
  }
  return;
}

Assistant:

void reoReorderArray( reo_man * p, DdManager * dd, DdNode * Funcs[], DdNode * FuncsRes[], int nFuncs, int * pOrder )
{
    int Counter, i;

    // set the initial parameters
    p->dd     = dd;
    p->pOrder = pOrder;
    p->nTops  = nFuncs;
    // get the initial number of nodes
    p->nNodesBeg = Cudd_SharingSize( Funcs, nFuncs );     
    // resize the internal data structures of the manager if necessary
    reoResizeStructures( p, ddMax(dd->size,dd->sizeZ), p->nNodesBeg, nFuncs );
    // compute the support
    p->pSupp = Extra_VectorSupportArray( dd, Funcs, nFuncs, p->pSupp );
    // get the number of support variables
    p->nSupp = 0;
    for ( i = 0; i < dd->size; i++ )
        p->nSupp += p->pSupp[i];

    // if it is the constant function, no need to reorder
    if ( p->nSupp == 0 )
    {
        for ( i = 0; i < nFuncs; i++ )
        {
            FuncsRes[i] = Funcs[i]; Cudd_Ref( FuncsRes[i] );
        }
        return;
    }

    // create the internal variable maps
    // go through variable levels in the manager
    Counter = 0;
    for ( i = 0; i < dd->size; i++ )
        if ( p->pSupp[ dd->invperm[i] ] )
        {
            p->pMapToPlanes[ dd->invperm[i] ] = Counter;
            p->pMapToDdVarsOrig[Counter]      = dd->invperm[i];
            if ( !p->fRemapUp )
                p->pMapToDdVarsFinal[Counter] = dd->invperm[i];
            else
                p->pMapToDdVarsFinal[Counter] = dd->invperm[Counter];
            p->pOrderInt[Counter]        = Counter;
            Counter++;
        }

    // set the initial parameters
    p->nUnitsUsed = 0;
    p->nNodesCur  = 0;
    p->fThisIsAdd = 0;
    p->Signature++;
    // transfer the function from the CUDD package into REO"s internal data structure
    for ( i = 0; i < nFuncs; i++ )
        p->pTops[i] = reoTransferNodesToUnits_rec( p, Funcs[i] );
    assert( p->nNodesBeg == p->nNodesCur );

    if ( !p->fThisIsAdd && p->fMinWidth )
    {
        printf( "An important message from the REO reordering engine:\n" );
        printf( "The BDD given to the engine for reordering contains complemented edges.\n" );
        printf( "Currently, such BDDs cannot be reordered for the minimum width.\n" );
        printf( "Therefore, minimization for the number of BDD nodes is performed.\n" );
        fflush( stdout );
        p->fMinApl   = 0;
        p->fMinWidth = 0;
    }

    if ( p->fMinWidth )
        reoProfileWidthStart(p);
    else if ( p->fMinApl )
        reoProfileAplStart(p);
    else 
        reoProfileNodesStart(p);

    if ( p->fVerbose )
    {
        printf( "INITIAL:\n" );
        if ( p->fMinWidth )
            reoProfileWidthPrint(p);
        else if ( p->fMinApl )
            reoProfileAplPrint(p);
        else
            reoProfileNodesPrint(p);
    }
 
    ///////////////////////////////////////////////////////////////////
    // performs the reordering
    p->nSwaps   = 0;
    p->nNISwaps = 0;
    for ( i = 0; i < p->nIters; i++ )
    {
        reoReorderSift( p );
        // print statistics after each iteration
        if ( p->fVerbose )
        {
            printf( "ITER #%d:\n", i+1 );
            if ( p->fMinWidth )
                reoProfileWidthPrint(p);
            else if ( p->fMinApl )
                reoProfileAplPrint(p);
            else
                reoProfileNodesPrint(p);
        }
        // if the cost function did not change, stop iterating
        if ( p->fMinWidth )
        {
            p->nWidthEnd = p->nWidthCur;
            assert( p->nWidthEnd <= p->nWidthBeg );
            if ( p->nWidthEnd == p->nWidthBeg )
                break;
        }
        else if ( p->fMinApl )
        {
            p->nAplEnd = p->nAplCur;
            assert( p->nAplEnd <= p->nAplBeg );
            if ( p->nAplEnd == p->nAplBeg )
                break;
        }
        else
        {
            p->nNodesEnd = p->nNodesCur;
            assert( p->nNodesEnd <= p->nNodesBeg );
            if ( p->nNodesEnd == p->nNodesBeg )
                break;
        }
    }
    assert( reoCheckLevels( p ) );
    ///////////////////////////////////////////////////////////////////

s_AplBefore = p->nAplBeg;
s_AplAfter  = p->nAplEnd;

    // set the initial parameters
    p->nRefNodes  = 0;
    p->nNodesCur  = 0;
    p->Signature++;
    // transfer the BDDs from REO's internal data structure to CUDD
    for ( i = 0; i < nFuncs; i++ )
    {
        FuncsRes[i] = reoTransferUnitsToNodes_rec( p, p->pTops[i] ); Cudd_Ref( FuncsRes[i] );
    }
    // undo the DDs referenced for storing in the cache
    for ( i = 0; i < p->nRefNodes; i++ )
        Cudd_RecursiveDeref( dd, p->pRefNodes[i] );
    // verify zero refs of the terminal nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        assert( reoRecursiveDeref( p->pTops[i] ) );
    }
    assert( reoCheckZeroRefs( &(p->pPlanes[p->nSupp]) ) );

    // prepare the variable map to return to the user
    if ( p->pOrder )
    {
        // i is the current level in the planes data structure
        // p->pOrderInt[i] is the original level in the planes data structure
        // p->pMapToDdVarsOrig[i] is the variable, into which we remap when we construct the BDD from planes
        // p->pMapToDdVarsOrig[ p->pOrderInt[i] ] is the original BDD variable corresponding to this level
        // Therefore, p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]
        // creates the permutation, which remaps the resulting BDD variable into the original BDD variable
        for ( i = 0; i < p->nSupp; i++ )
            p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
    }

    if ( p->fVerify )
    {
        int fVerification;
        DdNode * FuncRemapped;
        int * pOrder;

        if ( p->pOrder == NULL )
        {
            pOrder = ABC_ALLOC( int, p->nSupp );
            for ( i = 0; i < p->nSupp; i++ )
                pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
        }
        else
            pOrder = p->pOrder;

        fVerification = 1;
        for ( i = 0; i < nFuncs; i++ )
        {
            // verify the result
            if ( p->fThisIsAdd )
                FuncRemapped = Cudd_addPermute( dd, FuncsRes[i], pOrder );
            else
                FuncRemapped = Cudd_bddPermute( dd, FuncsRes[i], pOrder );
            Cudd_Ref( FuncRemapped );

            if ( FuncRemapped != Funcs[i] )
            {
                fVerification = 0;
                printf( "REO: Internal verification has failed!\n" );
                fflush( stdout );
            }
            Cudd_RecursiveDeref( dd, FuncRemapped );
        }
        if ( fVerification )
            printf( "REO: Internal verification is okay!\n" );

        if ( p->pOrder == NULL )
            ABC_FREE( pOrder );
    }

    // recycle the data structure
    for ( i = 0; i <= p->nSupp; i++ )
        reoUnitsRecycleUnitList( p, p->pPlanes + i );
}